

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O3

vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *
vk::enumerateDeviceExtensionProperties
          (vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
           *__return_storage_ptr__,InstanceInterface *vki,VkPhysicalDevice physicalDevice,
          char *layerName)

{
  uint in_EAX;
  VkResult VVar1;
  TestError *this;
  deUint32 numExtensions;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->
  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_28 = (ulong)in_EAX;
  VVar1 = (*vki->_vptr_InstanceInterface[10])(vki,physicalDevice,layerName,(long)&uStack_28 + 4,0);
  checkResult(VVar1,
              "vki.enumerateDeviceExtensionProperties(physicalDevice, layerName, &numExtensions, DE_NULL)"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
              ,0xe4);
  if (uStack_28 >> 0x20 != 0) {
    std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::resize
              (__return_storage_ptr__,uStack_28 >> 0x20);
    VVar1 = (*vki->_vptr_InstanceInterface[10])
                      (vki,physicalDevice,layerName,(long)&uStack_28 + 4,
                       (__return_storage_ptr__->
                       super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    checkResult(VVar1,
                "vki.enumerateDeviceExtensionProperties(physicalDevice, layerName, &numExtensions, &properties[0])"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                ,0xe9);
    if (((long)(__return_storage_ptr__->
               super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(__return_storage_ptr__->
               super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
               )._M_impl.super__Vector_impl_data._M_start >> 2) * 0xfc0fc0fc0fc0fc1 -
        (uStack_28 >> 0x20) != 0) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,(char *)0x0,"(size_t)numExtensions == properties.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                 ,0xea);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VkExtensionProperties> enumerateDeviceExtensionProperties (const InstanceInterface& vki, VkPhysicalDevice physicalDevice, const char* layerName)
{
	vector<VkExtensionProperties>	properties;
	deUint32						numExtensions	= 0;

	VK_CHECK(vki.enumerateDeviceExtensionProperties(physicalDevice, layerName, &numExtensions, DE_NULL));

	if (numExtensions > 0)
	{
		properties.resize(numExtensions);
		VK_CHECK(vki.enumerateDeviceExtensionProperties(physicalDevice, layerName, &numExtensions, &properties[0]));
		TCU_CHECK((size_t)numExtensions == properties.size());
	}

	return properties;
}